

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

usize __thiscall String::split(String *this,HashSet<String> *tokens,char *separators,bool skipEmpty)

{
  char *pcVar1;
  char *pcVar2;
  char *__s;
  String local_58;
  
  HashSet<String>::clear(tokens);
  pcVar1 = operator_cast_to_char_(this);
  __s = pcVar1;
  while( true ) {
    pcVar2 = strpbrk(__s,separators);
    if (pcVar2 == (char *)0x0) break;
    if ((long)pcVar2 - (long)__s == 0) {
      if (!skipEmpty) {
        local_58.data = &emptyData.super_Data;
        HashSet<String>::append(tokens,&local_58);
        ~String(&local_58);
      }
    }
    else {
      substr(&local_58,this,(long)__s - (long)pcVar1,(long)pcVar2 - (long)__s);
      HashSet<String>::append(tokens,&local_58);
      ~String(&local_58);
      __s = pcVar2;
    }
    __s = __s + 1;
  }
  if (__s < pcVar1 + this->data->len) {
    substr(&local_58,this,(long)__s - (long)pcVar1,-1);
    HashSet<String>::append(tokens,&local_58);
  }
  else {
    if (skipEmpty) goto LAB_0010b57f;
    local_58.data = &emptyData.super_Data;
    HashSet<String>::append(tokens,&local_58);
  }
  ~String(&local_58);
LAB_0010b57f:
  return *(usize *)(tokens + 0x10);
}

Assistant:

usize String::split(HashSet<String>& tokens, const char* separators, bool skipEmpty) const
{
  tokens.clear();

  const char* start = *this;
  const char* p = start, * endStr;
  for(;;)
  {
    endStr = strpbrk(p, separators);
    if(endStr)
    {
      usize len = endStr - p;
      if(len)
      {
        tokens.append(substr(p - start, len));
        p = endStr + 1;
      }
      else
      {
        if(!skipEmpty)
          tokens.append(String());
        ++p;
      }
    }
    else
    {
      if(p < start + data->len)
        tokens.append(substr(p - start));
      else if(!skipEmpty)
        tokens.append(String());
      break;
    }
  }
  return tokens.size();
}